

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_REP(Context *ctx)

{
  int iVar1;
  int iVar2;
  int id;
  char local_c8 [8];
  char scratch [32];
  int faillabel;
  int toplabel;
  char topbranch [32];
  char failbranch [32];
  char src0 [64];
  Context *ctx_local;
  
  make_ARB1_srcarg_string(ctx,0,failbranch + 0x18,0x40);
  if ((ctx->profile_supports_nv4 == 0) &&
     ((ctx->profile_supports_nv2 == 0 || (iVar2 = shader_is_pixel(ctx), iVar2 == 0)))) {
    if (ctx->profile_supports_nv2 == 0) {
      fail(ctx,"branching unsupported in this profile");
    }
    else {
      iVar2 = allocate_branch_label(ctx);
      id = allocate_branch_label(ctx);
      get_ARB1_branch_label_name(ctx,id,topbranch + 0x18,0x20);
      get_ARB1_branch_label_name(ctx,iVar2,(char *)&faillabel,0x20);
      if (0x1e < (uint)ctx->branch_labels_stack_index) {
        __assert_fail("((size_t) ctx->branch_labels_stack_index) < STATICARRAYLEN(ctx->branch_labels_stack)-1"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1e66,"void emit_ARB1_REP(Context *)");
      }
      iVar1 = ctx->branch_labels_stack_index;
      ctx->branch_labels_stack_index = iVar1 + 1;
      ctx->branch_labels_stack[iVar1] = iVar2;
      iVar2 = ctx->branch_labels_stack_index;
      ctx->branch_labels_stack_index = iVar2 + 1;
      ctx->branch_labels_stack[iVar2] = id;
      snprintf(local_c8,0x20,"rep%d",(ulong)(uint)ctx->reps);
      output_line(ctx,"MOVC %s.x, %s;",local_c8,failbranch + 0x18);
      output_line(ctx,"BRA %s (LE.x);",topbranch + 0x18);
      output_line(ctx,"%s:",&faillabel);
    }
  }
  else {
    output_line(ctx,"REP %s;",failbranch + 0x18);
  }
  return;
}

Assistant:

static void emit_ARB1_REP(Context *ctx)
{
    char src0[64]; make_ARB1_srcarg_string(ctx, 0, src0, sizeof (src0));

    // nv2 fragment programs (and everything nv4) have a real REP.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "REP %s;", src0);

    else if (support_nv2(ctx))
    {
        // no REP, but we can use branches.
        char failbranch[32];
        char topbranch[32];
        const int toplabel = allocate_branch_label(ctx);
        const int faillabel = allocate_branch_label(ctx);
        get_ARB1_branch_label_name(ctx,faillabel,failbranch,sizeof(failbranch));
        get_ARB1_branch_label_name(ctx,toplabel,topbranch,sizeof(topbranch));

        assert(((size_t) ctx->branch_labels_stack_index) <
                STATICARRAYLEN(ctx->branch_labels_stack)-1);

        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = toplabel;
        ctx->branch_labels_stack[ctx->branch_labels_stack_index++] = faillabel;

        char scratch[32];
        snprintf(scratch, sizeof (scratch), "rep%d", ctx->reps);
        output_line(ctx, "MOVC %s.x, %s;", scratch, src0);
        output_line(ctx, "BRA %s (LE.x);", failbranch);
        output_line(ctx, "%s:", topbranch);
    } // else if

    else  // stock ARB1 has no branching.
    {
        fail(ctx, "branching unsupported in this profile");
    } // else
}